

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

void aiMultiplyMatrix3(aiMatrix3x3 *dst,aiMatrix3x3 *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  
  if (dst == (aiMatrix3x3 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x28d,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
  }
  if (src != (aiMatrix3x3 *)0x0) {
    fVar1 = dst->c1;
    fVar2 = dst->c2;
    fVar3 = dst->c3;
    uVar13 = src->a2;
    uVar16 = src->a3;
    uVar14 = src->b2;
    uVar17 = src->b3;
    uVar15 = src->c2;
    uVar18 = src->c3;
    fVar4 = src->b1;
    fVar5 = src->a1;
    fVar6 = src->c1;
    fVar7 = dst->b2;
    fVar8 = dst->a1;
    fVar9 = dst->a2;
    fVar10 = dst->a3;
    fVar11 = dst->b1;
    fVar12 = dst->b3;
    dst->a1 = fVar10 * fVar6 + fVar8 * fVar5 + fVar4 * fVar9;
    dst->a2 = fVar10 * (float)uVar15 + fVar8 * (float)uVar13 + (float)uVar14 * fVar9;
    dst->a3 = fVar10 * (float)uVar18 + fVar8 * (float)uVar16 + (float)uVar17 * fVar9;
    dst->b1 = fVar12 * fVar6 + fVar11 * fVar5 + fVar4 * fVar7;
    dst->b2 = fVar12 * (float)uVar15 + fVar11 * (float)uVar13 + (float)uVar14 * fVar7;
    dst->b3 = fVar12 * (float)uVar18 + fVar11 * (float)uVar16 + (float)uVar17 * fVar7;
    dst->c1 = fVar3 * fVar6 + fVar1 * fVar5 + fVar4 * fVar2;
    dst->c2 = fVar3 * (float)uVar15 + fVar1 * (float)uVar13 + (float)uVar14 * fVar2;
    dst->c3 = (float)uVar18 * fVar3 + (float)uVar16 * fVar1 + (float)uVar17 * fVar2;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x28e,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix3(
    aiMatrix3x3* dst,
    const aiMatrix3x3* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}